

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::showNormal(QWidget *this)

{
  ensurePolished(this);
  setWindowState(this,(WindowStates)(*(uint *)&this->data->field_0x10 & 8));
  (**(code **)(*(long *)this + 0x68))(this,1);
  return;
}

Assistant:

void QWidget::showNormal()
{
    ensurePolished();

    setWindowState(windowState() & ~(Qt::WindowMinimized
                                     | Qt::WindowMaximized
                                     | Qt::WindowFullScreen));
    setVisible(true);
}